

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O0

int saisxx_private::
    suffixsort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               T,__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,long fs,
              long n,long k,bool isbwt)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  difference_type dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  long *plVar10;
  reference plVar11;
  reference puVar12;
  bool bVar13;
  long *local_1a8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_198;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> B_3;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> C_3;
  long *C_2;
  long *B_2;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_140;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_138;
  long *local_130;
  long *local_128;
  long *local_120;
  long local_118;
  long *local_110;
  long *local_108;
  long *local_100;
  long *local_f8;
  long *local_f0;
  long *local_e8;
  long *local_e0;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_d8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> B_1;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> C_1;
  long *B;
  long *C;
  char_type c1;
  char_type c0;
  int c;
  bool diff;
  long lStack_88;
  int pidx;
  long name;
  long qlen;
  long plen;
  long q;
  long p;
  long m;
  long j;
  long i;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> RA;
  bool isbwt_local;
  long k_local;
  long n_local;
  long fs_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA_local;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  T_local;
  
  RA._M_current._7_1_ = isbwt;
  fs_local = (long)SA._M_current;
  SA_local._M_current = (long *)T._M_current;
  __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::__normal_iterator
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i);
  c = 0;
  if (fs < k) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = k;
    uVar9 = SUB168(auVar6 * ZEXT816(8),0);
    if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    plVar10 = (long *)operator_new__(uVar9);
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long*,long>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )SA_local._M_current,plVar10,n,k);
    getBuckets<long*,long>(plVar10,plVar10,k,true);
    for (j = 0; j < n; j = j + 1) {
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      *plVar11 = 0;
    }
    c1 = 0;
    puVar12 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&SA_local,n + -1);
    C._4_4_ = *puVar12;
    for (j = n + -2; -1 < j; j = j + -1) {
      puVar12 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&SA_local,j);
      uVar1 = *puVar12;
      if (uVar1 < C._4_4_ + c1) {
        c1 = 1;
      }
      else if (c1 != 0) {
        lVar3 = plVar10[C._4_4_];
        plVar10[C._4_4_] = lVar3 + -1;
        plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *
                             )&fs_local,lVar3 + -1);
        *plVar11 = j + 1;
        c1 = 0;
      }
      C._4_4_ = uVar1;
    }
    induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )SA_local._M_current,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)fs_local,
               plVar10,plVar10,n,k);
    if (plVar10 != (long *)0x0) {
      operator_delete__(plVar10);
    }
  }
  else {
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
    __normal_iterator(&B_1);
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
    __normal_iterator(&local_d8);
    local_e8 = (long *)__gnu_cxx::
                       __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                       operator+((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                  *)&fs_local,n);
    local_e0 = local_e8;
    B_1 = (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)local_e8;
    if (k <= fs - k) {
      local_e8 = (long *)__gnu_cxx::
                         __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                         operator+(&B_1,k);
    }
    local_d8._M_current = local_e8;
    local_f0 = SA_local._M_current;
    local_f8 = B_1._M_current;
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )SA_local._M_current,B_1,n,k);
    local_100 = B_1._M_current;
    local_108 = local_d8._M_current;
    getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (B_1,local_d8,k,true);
    for (j = 0; j < n; j = j + 1) {
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      *plVar11 = 0;
    }
    c1 = 0;
    puVar12 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&SA_local,n + -1);
    C._4_4_ = *puVar12;
    for (j = n + -2; -1 < j; j = j + -1) {
      puVar12 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&SA_local,j);
      uVar1 = *puVar12;
      if (uVar1 < C._4_4_ + c1) {
        c1 = 1;
      }
      else if (c1 != 0) {
        plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator[](&local_d8,(ulong)C._4_4_);
        lVar3 = *plVar11;
        *plVar11 = lVar3 + -1;
        plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *
                             )&fs_local,lVar3 + -1);
        *plVar11 = j + 1;
        c1 = 0;
      }
      C._4_4_ = uVar1;
    }
    local_110 = SA_local._M_current;
    local_118 = fs_local;
    local_120 = B_1._M_current;
    local_128 = local_d8._M_current;
    induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )SA_local._M_current,
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)fs_local,B_1,
               local_d8,n,k);
  }
  p = 0;
  for (j = 0; j < n; j = j + 1) {
    plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
              operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                         &fs_local,j);
    lVar3 = *plVar11;
    if (0 < lVar3) {
      puVar12 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&SA_local,lVar3 + -1);
      uVar1 = *puVar12;
      puVar12 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&SA_local,lVar3);
      uVar2 = *puVar12;
      m = lVar3;
      if (uVar2 < uVar1) {
        do {
          m = m + 1;
          bVar13 = false;
          if (m < n) {
            puVar12 = __gnu_cxx::
                      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    *)&SA_local,m);
            C._4_4_ = *puVar12;
            bVar13 = uVar2 == C._4_4_;
          }
        } while (bVar13);
        if ((m < n) && (uVar2 < C._4_4_)) {
          plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                    ::operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                  *)&fs_local,p);
          *plVar11 = lVar3;
          p = p + 1;
        }
      }
    }
  }
  for (j = p; j < p + (n >> 1); j = j + 1) {
    plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
              operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                         &fs_local,j);
    *plVar11 = 0;
  }
  c1 = 0;
  puVar12 = __gnu_cxx::
            __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&SA_local,n + -1);
  C._4_4_ = *puVar12;
  m = n;
  for (j = n + -2; -1 < j; j = j + -1) {
    puVar12 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&SA_local,j);
    uVar1 = *puVar12;
    if (uVar1 < C._4_4_ + c1) {
      c1 = 1;
    }
    else if (c1 != 0) {
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,p + (j + 1 >> 1));
      *plVar11 = (m - j) + -1;
      m = j + 1;
      c1 = 0;
    }
    C._4_4_ = uVar1;
  }
  lStack_88 = 0;
  name = 0;
  plen = n;
  for (j = 0; j < p; j = j + 1) {
    plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
              operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                         &fs_local,j);
    lVar3 = *plVar11;
    plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
              operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                         &fs_local,p + (lVar3 >> 1));
    lVar4 = *plVar11;
    bVar13 = true;
    if (lVar4 == name) {
      m = 0;
      while( true ) {
        bVar13 = false;
        if (m < lVar4) {
          puVar12 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)&SA_local,lVar3 + m);
          uVar1 = *puVar12;
          puVar12 = __gnu_cxx::
                    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)&SA_local,plen + m);
          bVar13 = uVar1 == *puVar12;
        }
        if (!bVar13) break;
        m = m + 1;
      }
      bVar13 = m != lVar4;
    }
    if (bVar13) {
      lStack_88 = lStack_88 + 1;
      name = lVar4;
      plen = lVar3;
    }
    plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
              operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                         &fs_local,p + (lVar3 >> 1));
    *plVar11 = lStack_88;
  }
  if (lStack_88 < p) {
    local_140 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator+((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                          &fs_local,n);
    local_138 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator+(&local_140,fs);
    local_130 = (long *)__gnu_cxx::
                        __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                        operator-(&local_138,p);
    j = p + (n >> 1);
    m = p + -1;
    i = (long)local_130;
    while (j = j + -1, p <= j) {
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      if (*plVar11 != 0) {
        plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *
                             )&fs_local,j);
        lVar3 = *plVar11;
        plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *
                             )&i,m);
        *plVar11 = lVar3 + -1;
        m = m + -1;
      }
    }
    iVar8 = suffixsort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                      ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)i,
                       (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                       fs_local,fs + n + p * -2,p,lStack_88,false);
    if (iVar8 != 0) {
      return -2;
    }
    m = p + -1;
    c1 = 0;
    puVar12 = __gnu_cxx::
              __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&SA_local,n + -1);
    C._4_4_ = *puVar12;
    for (j = n + -2; -1 < j; j = j + -1) {
      puVar12 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&SA_local,j);
      uVar1 = *puVar12;
      if (uVar1 < C._4_4_ + c1) {
        c1 = 1;
      }
      else if (c1 != 0) {
        plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *
                             )&i,m);
        *plVar11 = j + 1;
        c1 = 0;
        m = m + -1;
      }
      C._4_4_ = uVar1;
    }
    for (j = 0; j < p; j = j + 1) {
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &i,*plVar11);
      lVar3 = *plVar11;
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      *plVar11 = lVar3;
    }
  }
  if (fs < k) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = k;
    uVar9 = SUB168(auVar7 * ZEXT816(8),0);
    if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    plVar10 = (long *)operator_new__(uVar9);
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long*,long>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )SA_local._M_current,plVar10,n,k);
    getBuckets<long*,long>(plVar10,plVar10,k,true);
    for (j = p; j < n; j = j + 1) {
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      *plVar11 = 0;
    }
    while (j = p + -1, -1 < j) {
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      dVar5 = *plVar11;
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      *plVar11 = 0;
      puVar12 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&SA_local,dVar5);
      lVar3 = plVar10[*puVar12];
      plVar10[*puVar12] = lVar3 + -1;
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,lVar3 + -1);
      *plVar11 = dVar5;
      p = j;
    }
    if ((RA._M_current._7_1_ & 1) == 0) {
      induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )SA_local._M_current,
                 (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)fs_local,
                 plVar10,plVar10,n,k);
    }
    else {
      c = computeBWT<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long*,long>
                    ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )SA_local._M_current,
                     (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)fs_local,
                     plVar10,plVar10,n,k);
    }
    if (plVar10 != (long *)0x0) {
      operator_delete__(plVar10);
    }
  }
  else {
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
    __normal_iterator(&B_3);
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
    __normal_iterator(&local_198);
    local_1a8 = (long *)__gnu_cxx::
                        __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                        operator+((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                   *)&fs_local,n);
    B_3 = (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)local_1a8;
    if (k <= fs - k) {
      local_1a8 = (long *)__gnu_cxx::
                          __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                          operator+(&B_3,k);
    }
    local_198._M_current = local_1a8;
    getCounts<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )SA_local._M_current,B_3,n,k);
    getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (B_3,local_198,k,true);
    for (j = p; j < n; j = j + 1) {
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      *plVar11 = 0;
    }
    while (j = p + -1, -1 < j) {
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      dVar5 = *plVar11;
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,j);
      *plVar11 = 0;
      puVar12 = __gnu_cxx::
                __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                ::operator[]((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&SA_local,dVar5);
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[](&local_198,(ulong)*puVar12);
      lVar3 = *plVar11;
      *plVar11 = lVar3 + -1;
      plVar11 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &fs_local,lVar3 + -1);
      *plVar11 = dVar5;
      p = j;
    }
    if ((RA._M_current._7_1_ & 1) == 0) {
      induceSA<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )SA_local._M_current,
                 (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)fs_local,B_3,
                 local_198,n,k);
    }
    else {
      c = computeBWT<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                    ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      )SA_local._M_current,
                     (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)fs_local,
                     B_3,local_198,n,k);
    }
  }
  return c;
}

Assistant:

int
suffixsort(string_type T, sarray_type SA,
           index_type fs, index_type n, index_type k,
           bool isbwt) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type RA;
  index_type i, j, m, p, q, plen, qlen, name;
  int pidx = 0;
  bool diff;
  int c;
#ifdef _OPENMP
  int maxthreads = omp_get_max_threads();
#else
# define maxthreads 1
#endif
  char_type c0, c1;

  /* stage 1: reduce the problem by at least 1/2
     sort all the S-substrings */
  if(fs < (maxthreads * k)) {
    index_type *C, *B;
    C = new index_type[maxthreads * k];
    B = (1 < maxthreads) ? C + k : C;
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < n; ++i) { SA[i] = 0; }
    for(i = n - 2, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { SA[--B[c1]] = i + 1, c = 0; }
    }
    induceSA(T, SA, C, B, n, k);
    delete [] C;
  } else {
    sarray_type C, B;
    C = SA + n;
    B = ((1 < maxthreads) || (k <= (fs - k))) ? C + k : C;
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < n; ++i) { SA[i] = 0; }
    for(i = n - 2, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { SA[--B[c1]] = i + 1, c = 0; }
    }
    induceSA(T, SA, C, B, n, k);
  }

  /* compact all the sorted substrings into the first m items of SA
     2*m must be not larger than n (proveable) */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i, j, p, c0, c1)
  for(i = 0; i < n; ++i) {
    p = SA[i];
    if((0 < p) && (T[p - 1] > (c0 = T[p]))) {
      for(j = p + 1; (j < n) && (c0 == (c1 = T[j])); ++j) { }
      if((j < n) && (c0 < c1)) { SA[i] = ~p; }
    }
  }
  for(i = 0, m = 0; i < n; ++i) { if((p = SA[i]) < 0) { SA[m++] = ~p; } }
#else
  for(i = 0, m = 0; i < n; ++i) {
    p = SA[i];
    if((0 < p) && (T[p - 1] > (c0 = T[p]))) {
      for(j = p + 1; (j < n) && (c0 == (c1 = T[j])); ++j) { }
      if((j < n) && (c0 < c1)) { SA[m++] = p; }
    }
  }
#endif
  j = m + (n >> 1);
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
  for(i = m; i < j; ++i) { SA[i] = 0; } /* init the name array buffer */
  /* store the length of all substrings */
  for(i = n - 2, j = n, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
    if((c0 = T[i]) < (c1 + c)) { c = 1; }
    else if(c != 0) { SA[m + ((i + 1) >> 1)] = j - i - 1; j = i + 1; c = 0; }
  }
  /* find the lexicographic names of all substrings */
  for(i = 0, name = 0, q = n, qlen = 0; i < m; ++i) {
    p = SA[i], plen = SA[m + (p >> 1)], diff = true;
    if(plen == qlen) {
      for(j = 0; (j < plen) && (T[p + j] == T[q + j]); ++j) { }
      if(j == plen) { diff = false; }
    }
    if(diff != false) { ++name, q = p, qlen = plen; }
    SA[m + (p >> 1)] = name;
  }

  /* stage 2: solve the reduced problem
     recurse if names are not yet unique */
  if(name < m) {
    RA = SA + n + fs - m;
    for(i = m + (n >> 1) - 1, j = m - 1; m <= i; --i) {
      if(SA[i] != 0) { RA[j--] = SA[i] - 1; }
    }
    if(suffixsort(RA, SA, fs + n - m * 2, m, name, false) != 0) { return -2; }
    for(i = n - 2, j = m - 1, c = 0, c1 = T[n - 1]; 0 <= i; --i, c1 = c0) {
      if((c0 = T[i]) < (c1 + c)) { c = 1; }
      else if(c != 0) { RA[j--] = i + 1, c = 0; } /* get p1 */
    }
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = 0; i < m; ++i) { SA[i] = RA[SA[i]]; } /* get index in s */
  }

  /* stage 3: induce the result for the original problem */
  if(fs < (maxthreads * k)) {
    index_type *B, *C;
    C = new index_type[maxthreads * k];
    B = (1 < maxthreads) ? C + k : C;
    /* put all left-most S characters into their buckets */
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = m; i < n; ++i) { SA[i] = 0; } /* init SA[m..n-1] */
    for(i = m - 1; 0 <= i; --i) {
      j = SA[i], SA[i] = 0;
      SA[--B[T[j]]] = j;
    }
    if(isbwt == false) { induceSA(T, SA, C, B, n, k); }
    else { pidx = computeBWT(T, SA, C, B, n, k); }
    delete [] C;
  } else {
    sarray_type C, B;
    C = SA + n;
    B = ((1 < maxthreads) || (k <= (fs - k))) ? C + k : C;
    /* put all left-most S characters into their buckets */
    getCounts(T, C, n, k); getBuckets(C, B, k, true); /* find ends of buckets */
#ifdef _OPENMP
#pragma omp parallel for default(shared) private(i)
#endif
    for(i = m; i < n; ++i) { SA[i] = 0; } /* init SA[m..n-1] */
    for(i = m - 1; 0 <= i; --i) {
      j = SA[i], SA[i] = 0;
      SA[--B[T[j]]] = j;
    }
    if(isbwt == false) { induceSA(T, SA, C, B, n, k); }
    else { pidx = computeBWT(T, SA, C, B, n, k); }
  }

  return pidx;
#ifndef _OPENMP
# undef maxthreads
#endif
}